

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random_generators.cpp
# Opt level: O2

Matrix3d * opengv::generateRandomRotation(void)

{
  PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>> *pPVar1;
  PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>> *pPVar2;
  double __x;
  double __x_00;
  int iVar3;
  int iVar4;
  int iVar5;
  PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>> *in_RDI;
  double dVar6;
  double dVar7;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined1 auVar8 [16];
  undefined8 extraout_XMM0_Qb_01;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  type local_1c8;
  Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true> local_1b0;
  PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>> *local_180 [3];
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined1 local_150 [16];
  Matrix3d *local_140;
  variable_if_dynamic<long,__1> local_138;
  variable_if_dynamic<long,__1> vStack_130;
  Index local_128;
  scalar_constant_op<double> local_118;
  Matrix3d R3;
  Matrix3d R2;
  Matrix3d R1;
  
  iVar3 = rand();
  iVar4 = rand();
  iVar5 = rand();
  R1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6] = 0.0;
  dVar7 = ((double)iVar3 / 2147483647.0 + -0.5) * 6.283185307179586;
  __x = ((double)iVar4 / 2147483647.0 + -0.5) * 3.141592653589793;
  __x_00 = ((double)iVar5 / 2147483647.0 + -0.5) * 6.283185307179586;
  dVar6 = cos(dVar7);
  R1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] = dVar6;
  R1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] =
       sin(dVar7);
  auVar9._0_8_ = -R1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                  array[5];
  auVar9._8_4_ = (int)extraout_XMM0_Qb;
  auVar9._12_4_ = (uint)((ulong)extraout_XMM0_Qb >> 0x20) ^ 0x80000000;
  R1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7] =
       (double)vmovlps_avx(auVar9);
  R1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] = 1.0;
  R1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] = 0.0;
  R1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] = 0.0;
  R1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] = 0.0;
  R1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] = dVar6;
  dVar7 = cos(__x);
  R2.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] = dVar7;
  R2.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6] =
       sin(__x);
  R2.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array._24_16_ =
       vmovhps_avx(ZEXT816(0) << 0x40,0x3ff0000000000000);
  auVar8._0_8_ = -R2.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                  array[6];
  auVar8._8_4_ = (undefined4)extraout_XMM0_Qb_00;
  auVar8._12_4_ = (uint)((ulong)extraout_XMM0_Qb_00 >> 0x20) ^ 0x80000000;
  R2.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] = 0.0;
  R2.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7] = 0.0;
  R2.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] =
       (double)vmovlps_avx(auVar8);
  R2.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] = 0.0;
  R2.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] = dVar7;
  dVar7 = cos(__x_00);
  R3.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] = dVar7;
  R3.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] =
       sin(__x_00);
  auVar10._0_8_ =
       -R3.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1];
  auVar10._8_4_ = (int)extraout_XMM0_Qb_01;
  auVar10._12_4_ = (uint)((ulong)extraout_XMM0_Qb_01 >> 0x20) ^ 0x80000000;
  R3.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] =
       (double)vmovlps_avx(auVar10);
  R3.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] = 0.0;
  R3.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] = 0.0;
  R3.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6] = 0.0;
  R3.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7] = 0.0;
  R3.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] = 1.0;
  local_150._0_8_ = &R3;
  local_150._8_8_ = &R2;
  local_140 = &R1;
  R3.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] = dVar7;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>>::
  _set_noalias<Eigen::Product<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,3,0,3,3>,0>,Eigen::Matrix<double,3,3,0,3,3>,0>>
            (in_RDI,(DenseBase<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
                     *)local_150);
  local_168 = 0;
  uStack_160 = 0;
  local_158 = 3;
  local_118.m_other =
       Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_>::norm
                 ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
                  local_180);
  local_138.m_value = 0;
  vStack_130.m_value = 0;
  local_128 = 3;
  local_1b0.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>.m_startRow.m_value =
       0;
  local_1b0.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>.m_startCol.m_value =
       0;
  local_1b0.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>.m_outerStride = 3;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>>
            (&local_1b0,
             (CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)local_150);
  pPVar1 = in_RDI + 0x18;
  local_168 = 0;
  local_138.m_value = 0;
  vStack_130.m_value = 0;
  local_128 = 3;
  uStack_160 = 1;
  local_158 = 3;
  local_180[0] = pPVar1;
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>>::
  cross<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>>
            (&local_1c8,local_150,
             (MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
             local_180);
  pPVar2 = in_RDI + 0x30;
  local_1b0.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>.m_startRow.m_value =
       0;
  local_1b0.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>.m_startCol.m_value =
       2;
  local_1b0.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>.m_outerStride = 3;
  local_1b0.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_0>.m_data =
       (PointerType)pPVar2;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>,Eigen::Matrix<double,3,1,0,3,1>>
            (&local_1b0,&local_1c8);
  local_168 = 0;
  uStack_160 = 2;
  local_158 = 3;
  local_180[0] = pPVar2;
  local_118.m_other =
       Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_>::norm
                 ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
                  local_180);
  local_138.m_value = 0;
  local_1b0.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>.m_startRow.m_value =
       0;
  vStack_130.m_value = 2;
  local_128 = 3;
  local_1b0.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>.m_startCol.m_value =
       2;
  local_1b0.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>.m_outerStride = 3;
  local_1b0.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_0>.m_data =
       (PointerType)pPVar2;
  local_150._0_8_ = pPVar2;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>>
            (&local_1b0,
             (CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)local_150);
  local_138.m_value = 0;
  vStack_130.m_value = 2;
  local_128 = 3;
  local_168 = 0;
  uStack_160 = 0;
  local_158 = 3;
  local_150._0_8_ = pPVar2;
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>>::
  cross<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>>
            (&local_1c8,local_150,
             (MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
             local_180);
  local_1b0.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>.m_startRow.m_value =
       0;
  local_1b0.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>.m_startCol.m_value =
       1;
  local_1b0.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>.m_outerStride = 3;
  local_1b0.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_0>.m_data =
       (PointerType)pPVar1;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>,Eigen::Matrix<double,3,1,0,3,1>>
            (&local_1b0,&local_1c8);
  local_168 = 0;
  uStack_160 = 1;
  local_158 = 3;
  local_180[0] = pPVar1;
  local_118.m_other =
       Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_>::norm
                 ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
                  local_180);
  local_138.m_value = 0;
  local_1b0.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>.m_startRow.m_value =
       0;
  vStack_130.m_value = 1;
  local_128 = 3;
  local_1b0.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>.m_startCol.m_value =
       1;
  local_1b0.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>.m_outerStride = 3;
  local_1b0.super_BlockImpl<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_0>.m_data =
       (PointerType)pPVar1;
  local_150._0_8_ = pPVar1;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,3,1,true>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>>
            (&local_1b0,
             (CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)local_150);
  return (Matrix3d *)in_RDI;
}

Assistant:

Eigen::Matrix3d
opengv::generateRandomRotation()
{
  Eigen::Vector3d rpy;
  rpy[0] = ((double) rand())/ ((double) RAND_MAX);
  rpy[1] = ((double) rand())/ ((double) RAND_MAX);
  rpy[2] = ((double) rand())/ ((double) RAND_MAX);

  rpy[0] = 2*M_PI*(rpy[0]-0.5);
  rpy[1] = M_PI*(rpy[1]-0.5);
  rpy[2] = 2*M_PI*(rpy[2]-0.5);

  Matrix3d R1;
  R1(0,0) = 1.0;
  R1(0,1) = 0.0;
  R1(0,2) = 0.0;
  R1(1,0) = 0.0;
  R1(1,1) = cos(rpy[0]);
  R1(1,2) = -sin(rpy[0]);
  R1(2,0) = 0.0;
  R1(2,1) = -R1(1,2);
  R1(2,2) = R1(1,1);

  Matrix3d R2;
  R2(0,0) = cos(rpy[1]);
  R2(0,1) = 0.0;
  R2(0,2) = sin(rpy[1]);
  R2(1,0) = 0.0;
  R2(1,1) = 1.0;
  R2(1,2) = 0.0;
  R2(2,0) = -R2(0,2);
  R2(2,1) = 0.0;
  R2(2,2) = R2(0,0);

  Matrix3d R3;
  R3(0,0) = cos(rpy[2]);
  R3(0,1) = -sin(rpy[2]);
  R3(0,2) = 0.0;
  R3(1,0) =-R3(0,1);
  R3(1,1) = R3(0,0);
  R3(1,2) = 0.0;
  R3(2,0) = 0.0;
  R3(2,1) = 0.0;
  R3(2,2) = 1.0;

  Matrix3d rotation = R3 * R2 * R1;

  rotation.col(0) = rotation.col(0) / rotation.col(0).norm();
  rotation.col(2) = rotation.col(0).cross(rotation.col(1));
  rotation.col(2) = rotation.col(2) / rotation.col(2).norm();
  rotation.col(1) = rotation.col(2).cross(rotation.col(0));
  rotation.col(1) = rotation.col(1) / rotation.col(1).norm();

  return rotation;
}